

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O0

value value_type_demotion_boolean(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  value pvVar2;
  type_id in_ESI;
  value in_RDI;
  size_t iterator;
  type_id v_id;
  value demotion;
  anon_union_8_3_4e909c24 buffer;
  type_id id_01;
  uchar b;
  float *v_00;
  void *in_stack_ffffffffffffffc8;
  ulong uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float local_20;
  undefined4 uStack_1c;
  type_id local_14;
  value local_10;
  value local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(&local_20,0,8);
  id_00 = value_type_id((value)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar1 = type_id_integer(id_00);
  if (((iVar1 == 0) || (iVar1 = type_id_decimal(id_00), iVar1 == 0)) &&
     (iVar1 = type_id_boolean(local_14), pvVar2 = local_10, iVar1 == 0)) {
    if (id_00 == local_14) {
      local_8 = local_10;
    }
    else {
      v_00 = &local_20;
      id_01 = (type_id)((ulong)local_10 >> 0x20);
      value_type_id_size(id_01);
      value_to((value)CONCAT44(id_00,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               (size_t)v_00);
      value_type_id_size(id_01);
      local_8 = value_type_create(in_stack_ffffffffffffffc8,(size_t)v_00,id_01);
      if (local_8 == (value)0x0) {
        local_8 = local_10;
      }
      else {
        value_destroy(v_00);
        iVar1 = type_id_decimal(id_00);
        b = (uchar)((ulong)pvVar2 >> 0x38);
        if (iVar1 == 0) {
          if (id_00 == 5) {
            if (((local_20 != 0.0) || (NAN(local_20))) && ((local_20 != -0.0 || (NAN(local_20))))) {
              local_8 = value_from_bool(v_00,b);
            }
          }
          else if (((id_00 == 6) &&
                   (((double)CONCAT44(uStack_1c,local_20) != 0.0 ||
                    (NAN((double)CONCAT44(uStack_1c,local_20)))))) &&
                  (((double)CONCAT44(uStack_1c,local_20) != -0.0 ||
                   (NAN((double)CONCAT44(uStack_1c,local_20)))))) {
            local_8 = value_from_bool(v_00,b);
          }
        }
        else {
          for (uVar3 = 0; uVar3 < 8; uVar3 = uVar3 + 1) {
            if (*(char *)((long)&local_20 + uVar3) != '\0') {
              pvVar2 = value_from_bool(v_00,b);
              return pvVar2;
            }
          }
        }
      }
    }
  }
  else {
    local_8 = (value)0x0;
  }
  return local_8;
}

Assistant:

value value_type_demotion_boolean(value v, type_id id)
{
	union
	{
		char b[8];
		float f;
		double d;
	} buffer = {
		{ 0 }
	};

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (!(type_id_integer(v_id) == 0 || type_id_decimal(v_id) == 0) || type_id_boolean(id) != 0)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer.b[0], value_type_id_size(v_id));

	demotion = value_type_create(NULL, value_type_id_size(id), id);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	if (type_id_decimal(v_id) == 0)
	{
		if (v_id == TYPE_FLOAT)
		{
			if (buffer.f != 0.0f && buffer.f != -0.0f)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else if (v_id == TYPE_DOUBLE)
		{
			if (buffer.d != 0.0 && buffer.d != -0.0)
			{
				return value_from_bool(demotion, 1L);
			}
		}
		else
		{
			/* error */
		}
	}
	else
	{
		size_t iterator;

		for (iterator = 0; iterator < 8; ++iterator)
		{
			if (buffer.b[iterator] != 0x00)
			{
				return value_from_bool(demotion, 1L);
			}
		}
	}

	return demotion;
}